

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_87ea::test_art_upper_bound(void **param_1)

{
  _Bool _Var1;
  long lVar2;
  ulong uVar3;
  initializer_list<const_char_*> __l;
  initializer_list<unsigned_long> __l_00;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  art_iterator_t iterator;
  art_t art;
  vector<const_char_*,_std::allocator<const_char_*>_> local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_170;
  art_iterator_t local_158;
  art_t local_c8;
  
  local_c8.first_free[3] = 0x10e13f;
  local_c8.first_free[1] = 0x10e131;
  local_c8.first_free[2] = 0x10e138;
  local_c8.root = 0x10e123;
  local_c8.first_free[0] = 0x10e12a;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_c8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_188,__l,(allocator_type *)&local_158);
  local_c8.first_free[1] = 3;
  local_c8.first_free[2] = 4;
  local_c8.root = 1;
  local_c8.first_free[0] = 2;
  local_c8.first_free[3] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = &local_c8.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_170,__l_00,(allocator_type *)&local_158);
  art_init_cleared(&local_c8);
  if (local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      art_insert(&local_c8,
                 (art_key_chunk_t *)
                 local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],
                 local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar3]);
      assert_art_valid((art_t *)&local_c8);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_188.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_188.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_upper_bound(&local_158,&local_c8,(art_key_chunk_t *)"000002");
  lVar2 = 0x10;
  do {
    _assert_true((ulong)(local_158.value != (art_val_t *)0x0),"iterator.value != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                 ,0x206);
    assert_key_eq(local_158.key,
                  *(art_key_chunk_t **)
                   ((long)local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar2));
    _assert_true((ulong)(*local_158.value ==
                        *(art_val_t *)
                         ((long)local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar2)),
                 "*iterator.value == values[i]",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                 ,0x208);
    _Var1 = art_iterator_next(&local_158);
    lVar2 = lVar2 + 8;
  } while (_Var1);
  art_upper_bound(&local_158,&local_c8,(art_key_chunk_t *)"000005");
  _assert_true((ulong)(local_158.value != (art_val_t *)0x0),"iterator.value != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x20f);
  assert_key_eq(local_158.key,
                (art_key_chunk_t *)
                local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[4]);
  _assert_true((ulong)(*local_158.value ==
                      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[4]),"*iterator.value == values[4]",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x211);
  _Var1 = art_iterator_next(&local_158);
  _assert_true((ulong)!_Var1,"art_iterator_next(&iterator)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x212);
  art_upper_bound(&local_158,&local_c8,(art_key_chunk_t *)"001006");
  _assert_true((ulong)(local_158.value == (art_val_t *)0x0),"iterator.value == NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x217);
  art_free(&local_c8);
  if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_art_upper_bound) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<art_val_t> values = {1, 2, 3, 4, 5};
    art_t art;
    art_init_cleared(&art);
    for (size_t i = 0; i < keys.size(); ++i) {
        art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
        assert_art_valid(&art);
    }

    {
        const char* key = "000002";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        size_t i = 2;
        do {
            assert_true(iterator.value != NULL);
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[i]);
            assert_true(*iterator.value == values[i]);
            ++i;
        } while (art_iterator_next(&iterator));
    }
    {
        const char* key = "000005";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        assert_true(iterator.value != NULL);
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        assert_true(*iterator.value == values[4]);
        assert_false(art_iterator_next(&iterator));
    }
    {
        const char* key = "001006";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        assert_true(iterator.value == NULL);
    }
    art_free(&art);
}